

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool __thiscall implementations::scheme::SchemeFrame::resolveArgument(SchemeFrame *this,cell *value)

{
  bool bVar1;
  cell *pcVar2;
  SchemeFrame *this_00;
  shared_ptr<implementations::scheme::environment> local_30;
  cell *local_20;
  cell *value_local;
  SchemeFrame *this_local;
  
  local_20 = value;
  value_local = (cell *)this;
  if (value->type == Symbol) {
    pcVar2 = lookup(this,&value->val);
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    push_back(&this->resolved_arguments,pcVar2);
    this_local._7_1_ = true;
  }
  else if (value->type == List) {
    bVar1 = std::
            vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
            empty(&value->list);
    if (bVar1) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->resolved_arguments,local_20);
      this_local._7_1_ = true;
    }
    else {
      this_00 = (SchemeFrame *)operator_new(0x138);
      pcVar2 = local_20;
      std::shared_ptr<implementations::scheme::environment>::shared_ptr
                (&local_30,
                 &(this->
                  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                  ).env);
      SchemeFrame(this_00,pcVar2,&local_30);
      this->subframe = this_00;
      std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_30);
      this->subframe_mode = Argument;
      this_local._7_1_ = false;
    }
  }
  else {
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    push_back(&this->resolved_arguments,value);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool resolveArgument(const cell &value) {
		switch (value.type) {
		case Symbol:
			resolved_arguments.push_back(lookup(value.val));
			DEBUG(std::string("  resolveArgument(") + to_string(value) + std::string(") = ") + to_string(lookup(value.val)));
			return true;
		case List:
			if (value.list.empty()) {
				resolved_arguments.push_back(value);
				return true;
			}
			// Function call. Create frame to execute it.
			subframe = new SchemeFrame(value, env);
			subframe_mode = Argument;
			return false;
		default:
			DEBUG(std::string("  resolveArgument(") + to_string(value) + std::string(") = ") + to_string(value));
			resolved_arguments.push_back(value);
			return true;
		}
	}